

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Group.cpp
# Opt level: O0

void __thiscall uWS::Group<false>::removeWebSocket(Group<false> *this,uv_poll_t *webSocket)

{
  long lVar1;
  value_type puVar2;
  size_type sVar3;
  reference ppuVar4;
  long *in_RSI;
  long in_RDI;
  SocketData *socketData;
  
  lVar1 = *in_RSI;
  sVar3 = std::stack<uv_poll_s_*,_std::deque<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>_>::size
                    ((stack<uv_poll_s_*,_std::deque<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>_> *)
                     0x123fe1);
  if (sVar3 != 0) {
    puVar2 = *(value_type *)(lVar1 + 0x30);
    ppuVar4 = std::stack<uv_poll_s_*,_std::deque<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>_>::top
                        ((stack<uv_poll_s_*,_std::deque<uv_poll_s_*,_std::allocator<uv_poll_s_*>_>_>
                          *)0x124005);
    *ppuVar4 = puVar2;
  }
  if (*(long *)(lVar1 + 0x38) == *(long *)(lVar1 + 0x30)) {
    *(undefined8 *)(in_RDI + 0x180) = 0;
  }
  else {
    if (*(long *)(lVar1 + 0x38) == 0) {
      *(undefined8 *)(in_RDI + 0x180) = *(undefined8 *)(lVar1 + 0x30);
    }
    else {
      *(undefined8 *)(**(long **)(lVar1 + 0x38) + 0x30) = *(undefined8 *)(lVar1 + 0x30);
    }
    if (*(long *)(lVar1 + 0x30) != 0) {
      *(undefined8 *)(**(long **)(lVar1 + 0x30) + 0x38) = *(undefined8 *)(lVar1 + 0x38);
    }
  }
  return;
}

Assistant:

void Group<isServer>::removeWebSocket(uv_poll_t *webSocket) {
    uS::SocketData *socketData = (uS::SocketData *) webSocket->data;
    if (iterators.size()) {
        iterators.top() = socketData->next;
    }
    if (socketData->prev == socketData->next) {
        webSocketHead = (uv_poll_t *) nullptr;
    } else {
        if (socketData->prev) {
            ((uS::SocketData *) socketData->prev->data)->next = socketData->next;
        } else {
            webSocketHead = socketData->next;
        }
        if (socketData->next) {
            ((uS::SocketData *) socketData->next->data)->prev = socketData->prev;
        }
    }
}